

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spdlog_utils.cc
# Opt level: O0

void __thiscall
lf::base::LineFeedFormatter::format(LineFeedFormatter *this,log_msg *msg,memory_buf_t *dest)

{
  level_enum lVar1;
  time_point log_time;
  source_loc sVar2;
  string_view_t msg_00;
  string_view_t sVar3;
  string_view_t a_logger_name;
  undefined8 uVar4;
  iterator pcVar5;
  size_t sVar6;
  pointer pfVar7;
  char *pcVar8;
  size_t old_end;
  size_t local_2b0;
  char *local_2a8;
  size_t local_2a0;
  char *local_298;
  undefined8 local_290;
  char *local_288;
  time_point local_280;
  undefined1 local_278 [8];
  log_msg part;
  size_t sStack_210;
  undefined1 local_1d0 [8];
  log_msg empty_msg;
  allocator<char> local_159;
  undefined1 local_158 [8];
  memory_buf_t temp_dest;
  char *it;
  char *begin;
  int offset;
  memory_buf_t *dest_local;
  log_msg *msg_local;
  LineFeedFormatter *this_local;
  
  begin._4_4_ = -2;
  it = ::fmt::v10::basic_string_view<char>::begin(&msg->payload);
  temp_dest._280_8_ = ::fmt::v10::basic_string_view<char>::begin(&msg->payload);
  do {
    uVar4 = temp_dest._280_8_;
    pcVar5 = ::fmt::v10::basic_string_view<char>::end(&msg->payload);
    if (((iterator)uVar4 == pcVar5) || (*(char *)temp_dest._280_8_ == '\n')) {
      if (begin._4_4_ == -2) {
        begin._4_4_ = -1;
      }
      else if (begin._4_4_ == -1) {
        std::allocator<char>::allocator();
        ::fmt::v10::basic_memory_buffer<char,_250UL,_std::allocator<char>_>::basic_memory_buffer
                  ((basic_memory_buffer<char,_250UL,_std::allocator<char>_> *)local_158,&local_159);
        std::allocator<char>::~allocator(&local_159);
        log_time.__d.__r = (duration)(msg->time).__d.__r;
        sVar2 = msg->source;
        sVar3 = msg->logger_name;
        lVar1 = msg->level;
        ::fmt::v10::basic_string_view<char>::basic_string_view
                  ((basic_string_view<char> *)&part.payload.size_);
        msg_00.size_ = sStack_210;
        msg_00.data_ = (char *)part.payload.size_;
        spdlog::details::log_msg::log_msg((log_msg *)local_1d0,log_time,sVar2,sVar3,lVar1,msg_00);
        pfVar7 = std::unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_>::
                 operator->(&this->wrapped_formatter_);
        (*pfVar7->_vptr_formatter[2])(pfVar7,local_1d0,local_158);
        sVar6 = ::fmt::v10::detail::buffer<char>::size((buffer<char> *)local_158);
        begin._4_4_ = (int)sVar6 + -1;
        ::fmt::v10::basic_memory_buffer<char,_250UL,_std::allocator<char>_>::~basic_memory_buffer
                  ((basic_memory_buffer<char,_250UL,_std::allocator<char>_> *)local_158);
      }
      local_280.__d.__r = (duration)(msg->time).__d.__r;
      local_298 = (msg->source).filename;
      local_290 = *(undefined8 *)&(msg->source).line;
      local_288 = (msg->source).funcname;
      local_2a8 = (msg->logger_name).data_;
      local_2a0 = (msg->logger_name).size_;
      lVar1 = msg->level;
      ::fmt::v10::basic_string_view<char>::basic_string_view
                ((basic_string_view<char> *)&old_end,it,temp_dest._280_8_ - (long)it);
      a_logger_name.size_ = local_2a0;
      a_logger_name.data_ = local_2a8;
      sVar2._8_8_ = local_290;
      sVar2.filename = local_298;
      sVar2.funcname = local_288;
      sVar3.size_ = local_2b0;
      sVar3.data_ = (char *)old_end;
      spdlog::details::log_msg::log_msg
                ((log_msg *)local_278,local_280,sVar2,a_logger_name,lVar1,sVar3);
      sVar6 = ::fmt::v10::detail::buffer<char>::size(&dest->super_buffer<char>);
      pfVar7 = std::unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_>::
               operator->(&this->wrapped_formatter_);
      (*pfVar7->_vptr_formatter[2])(pfVar7,local_278,dest);
      if (0 < begin._4_4_) {
        pcVar8 = ::fmt::v10::detail::buffer<char>::data(&dest->super_buffer<char>);
        memset(pcVar8 + sVar6,0x20,(long)begin._4_4_);
      }
      uVar4 = temp_dest._280_8_;
      pcVar5 = ::fmt::v10::basic_string_view<char>::end(&msg->payload);
      if ((iterator)uVar4 == pcVar5) {
        return;
      }
      it = (char *)(temp_dest._280_8_ + 1);
    }
    temp_dest._280_8_ = temp_dest._280_8_ + 1;
  } while( true );
}

Assistant:

void LineFeedFormatter::format(const spdlog::details::log_msg& msg,
                               spdlog::memory_buf_t& dest) {
  int offset = -2;  // -2: first line, // -1 second line
  const auto* begin = msg.payload.begin();

  for (const auto* it = msg.payload.begin();; ++it) {
    if (it == msg.payload.end() || *it == '\n') {
      if (offset == -2) {
        ++offset;
      } else if (offset == -1) {
        // the log message has more than one line
        // => determine the offset
        spdlog::memory_buf_t temp_dest;
        const spdlog::details::log_msg empty_msg(msg.time, msg.source,
                                                 msg.logger_name, msg.level,
                                                 spdlog::string_view_t());
        wrapped_formatter_->format(empty_msg, temp_dest);
        offset = static_cast<int>(temp_dest.size() - 1);
      }

      const spdlog::details::log_msg part(
          msg.time, msg.source, msg.logger_name, msg.level,
          spdlog::string_view_t(begin, it - begin));

      auto old_end = dest.size();
      wrapped_formatter_->format(part, dest);

      if (offset > 0) {
        std::memset(dest.data() + old_end, ' ', offset);
      }

      if (it == msg.payload.end()) {
        break;
      }
      begin = it + 1;
    }
  }
}